

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getStencilName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkStencilOpState *stencilOpState)

{
  ostream *poVar1;
  char *pcVar2;
  VkCompareOp compareOp;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream name;
  VkStencilOpState *stencilOpState_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"fail_");
  pcVar2 = pipeline::anon_unknown_0::getShortName(*(VkStencilOp *)this);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"_pass_");
  pcVar2 = pipeline::anon_unknown_0::getShortName(*(VkStencilOp *)(this + 4));
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"_dfail_");
  pcVar2 = pipeline::anon_unknown_0::getShortName(*(VkStencilOp *)(this + 8));
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"_comp_");
  getShortName_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)(ulong)*(uint *)(this + 0xc),compareOp);
  std::operator<<(poVar1,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getStencilName(const VkStencilOpState& stencilOpState)
{
	std::ostringstream name;

	name << "fail_" << getShortName(stencilOpState.failOp)
		 << "_pass_" << getShortName(stencilOpState.passOp)
		 << "_dfail_" << getShortName(stencilOpState.depthFailOp)
		 << "_comp_" << getShortName(stencilOpState.compareOp);

	return name.str();
}